

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

double __thiscall ON_Displacement::PostWeldAngle(ON_Displacement *this)

{
  ON_InternalXMLImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,40.0);
  ON_InternalXMLImpl::GetParameter(&local_200,this_00,L"",L"post-weld-angle",&local_108);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_Displacement::PostWeldAngle(void) const
{
  return m_impl->GetParameter(ON_DISPLACEMENT_POST_WELD_ANGLE, 40.0).AsDouble();
}